

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  ALLEGRO_EVENT *pAVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = 0;
  heartbeat();
  _al_mutex_lock(&queue->mutex);
  while (queue->events_head == queue->events_tail) {
    pthread_cond_wait((pthread_cond_t *)&queue->cond,(pthread_mutex_t *)&(queue->mutex).mutex);
  }
  if (ret_event != (ALLEGRO_EVENT *)0x0) {
    pAVar1 = get_next_event_if_any(queue,true);
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)ret_event = *(undefined8 *)pAVar1;
      pAVar1 = (ALLEGRO_EVENT *)((long)pAVar1 + (ulong)bVar3 * -0x10 + 8);
      ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar3 * -0x10 + 8);
    }
  }
  _al_mutex_unlock(&queue->mutex);
  return;
}

Assistant:

void al_wait_for_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event = NULL;

   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);
   {
      while (is_event_queue_empty(queue)) {
         _al_cond_wait(&queue->cond, &queue->mutex);
      }

      if (ret_event) {
         next_event = get_next_event_if_any(queue, true);
         copy_event(ret_event, next_event);
      }
   }
   _al_mutex_unlock(&queue->mutex);
}